

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

int raviX_ptrlist_linearize(PtrList *head,void **arr,int max)

{
  int iVar1;
  int iVar2;
  PtrList *list;
  PtrList *pPVar3;
  
  iVar2 = 0;
  if (0 < max && head != (PtrList *)0x0) {
    iVar2 = 0;
    pPVar3 = head;
    do {
      iVar1 = (int)*(char *)pPVar3;
      if (max < *(char *)pPVar3) {
        iVar1 = max;
      }
      memcpy(arr,pPVar3->list_,(long)iVar1 * 8);
      iVar2 = iVar2 + iVar1;
      max = max - iVar1;
      if (max == 0) {
        return iVar2;
      }
      arr = arr + iVar1;
      pPVar3 = pPVar3->next_;
    } while (pPVar3 != head);
  }
  return iVar2;
}

Assistant:

int raviX_ptrlist_linearize(PtrList *head, void **arr, int max)
{
	int nr = 0;
	if (head && max > 0) {
		PtrList *list = head;

		do {
			int i = list->nr_;
			if (i > max)
				i = max;
			memcpy(arr, list->list_, i * sizeof(void *));
			arr += i;
			nr += i;
			max -= i;
			if (!max)
				break;
		} while ((list = list->next_) != head);
	}
	return nr;
}